

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

unsigned_long kwssys::SystemTools::FileLength(string *filename)

{
  int iVar1;
  char *__file;
  stat fs;
  unsigned_long length;
  stat local_a0;
  unsigned_long local_10;
  
  local_10 = 0;
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = stat(__file,&local_a0);
  if (iVar1 == 0) {
    local_10 = local_a0.st_size;
  }
  return local_10;
}

Assistant:

unsigned long SystemTools::FileLength(const std::string& filename)
{
  unsigned long length = 0;
#ifdef _WIN32
  WIN32_FILE_ATTRIBUTE_DATA fs;
  if (GetFileAttributesExW(Encoding::ToWindowsExtendedPath(filename).c_str(),
                           GetFileExInfoStandard, &fs) != 0) {
    /* To support the full 64-bit file size, use fs.nFileSizeHigh
     * and fs.nFileSizeLow to construct the 64 bit size

    length = ((__int64)fs.nFileSizeHigh << 32) + fs.nFileSizeLow;
     */
    length = static_cast<unsigned long>(fs.nFileSizeLow);
  }
#else
  struct stat fs;
  if (stat(filename.c_str(), &fs) == 0) {
    length = static_cast<unsigned long>(fs.st_size);
  }
#endif
  return length;
}